

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O1

string * __thiscall
SchemeVector::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemeVector *this)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  shared_ptr<SchemePair> sVar4;
  SchemeVector local_40;
  shared_ptr<SchemeObject> local_20;
  
  sVar4 = to_list(&local_40);
  (**(code **)(*local_40.super_SchemeObject._vptr_SchemeObject + 0x10))
            (&local_40.vec.
              super__Vector_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
              ._M_impl.super__Vector_impl_data._M_finish,
             local_40.super_SchemeObject._vptr_SchemeObject,
             sVar4.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  plVar2 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_40.vec.
                                      super__Vector_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish,0,(char *)0x0,
                              0x14c256);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_40.vec.
      super__Vector_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != &local_20) {
    operator_delete(local_40.vec.
                    super__Vector_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,
                    (ulong)((long)&(local_20.
                                    super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->_vptr_SchemeObject + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_40.vec.
      super__Vector_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_40.vec.
               super__Vector_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeVector::external_repr() const
{
    return "#" + to_list()->external_repr();
}